

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup3.c
# Opt level: O3

void hashlittle2(void *key,size_t length,uint32_t *pc,uint32_t *pb)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  
  uVar4 = (int)length + *pc + 0xdeadbeef;
  uVar1 = *pb + uVar4;
  uVar3 = uVar4;
  if (((ulong)key & 3) != 0) {
    if (((ulong)key & 1) != 0) {
      if (0xc < length) {
        do {
          iVar2 = (uint)*(byte *)((long)key + 7) * 0x1000000 +
                  (uint)*(byte *)((long)key + 6) * 0x10000 +
                  (uint)*(byte *)((long)key + 5) * 0x100 + (byte)*(uint *)((long)key + 4) + uVar3;
          uVar5 = (uint)*(byte *)((long)key + 0xb) * 0x1000000 +
                  (uint)*(byte *)((long)key + 10) * 0x10000 +
                  (uint)*(byte *)((long)key + 9) * 0x100 + (byte)*(uint *)((long)key + 8) + uVar1;
          uVar1 = (uVar5 * 0x10 | uVar5 >> 0x1c) ^
                  ((uint)*(byte *)((long)key + 3) * 0x1000000 +
                   (uint)*(byte *)((long)key + 2) * 0x10000 +
                  (uint)*(byte *)((long)key + 1) * 0x100 + (byte)*key + uVar4) - uVar5;
          iVar6 = uVar5 + iVar2;
          uVar5 = (uVar1 << 6 | uVar1 >> 0x1a) ^ iVar2 - uVar1;
          iVar2 = uVar1 + iVar6;
          uVar1 = (uVar5 << 8 | uVar5 >> 0x18) ^ iVar6 - uVar5;
          iVar6 = uVar5 + iVar2;
          uVar7 = (uVar1 << 0x10 | uVar1 >> 0x10) ^ iVar2 - uVar1;
          iVar2 = uVar1 + iVar6;
          uVar5 = (uVar7 << 0x13 | uVar7 >> 0xd) ^ iVar6 - uVar7;
          uVar4 = uVar7 + iVar2;
          uVar1 = (uVar5 << 4 | uVar5 >> 0x1c) ^ iVar2 - uVar5;
          uVar3 = uVar5 + uVar4;
          length = length - 0xc;
          key = (void *)((long)key + 0xc);
        } while (0xc < length);
      }
      switch(length) {
      case 0:
        goto switchD_00110544_caseD_0;
      case 0xc:
        uVar1 = uVar1 + (uint)*(byte *)((long)key + 0xb) * 0x1000000;
      case 0xb:
        uVar1 = uVar1 + (uint)*(byte *)((long)key + 10) * 0x10000;
      case 10:
        uVar1 = uVar1 + (uint)*(byte *)((long)key + 9) * 0x100;
      case 9:
        uVar1 = uVar1 + (byte)*(uint *)((long)key + 8);
      case 8:
        uVar3 = uVar3 + (uint)*(byte *)((long)key + 7) * 0x1000000;
      case 7:
        uVar3 = uVar3 + (uint)*(byte *)((long)key + 6) * 0x10000;
      case 6:
        uVar3 = uVar3 + (uint)*(byte *)((long)key + 5) * 0x100;
      case 5:
        uVar3 = uVar3 + (byte)*(uint *)((long)key + 4);
      case 4:
        uVar4 = uVar4 + (uint)*(byte *)((long)key + 3) * 0x1000000;
      case 3:
        uVar4 = uVar4 + (uint)*(byte *)((long)key + 2) * 0x10000;
      case 2:
        uVar4 = uVar4 + (uint)*(byte *)((long)key + 1) * 0x100;
      }
      goto switchD_001106ed_caseD_1;
    }
    if (0xc < length) {
      do {
        uVar1 = uVar1 + *(uint *)((long)key + 8);
        uVar5 = (uVar1 * 0x10 | uVar1 >> 0x1c) ^ (uVar4 + *key) - uVar1;
        iVar2 = uVar1 + uVar3 + *(uint *)((long)key + 4);
        uVar7 = (uVar5 << 6 | uVar5 >> 0x1a) ^ (uVar3 + *(uint *)((long)key + 4)) - uVar5;
        iVar6 = uVar5 + iVar2;
        uVar1 = (uVar7 << 8 | uVar7 >> 0x18) ^ iVar2 - uVar7;
        iVar8 = uVar7 + iVar6;
        uVar7 = (uVar1 << 0x10 | uVar1 >> 0x10) ^ iVar6 - uVar1;
        iVar2 = uVar1 + iVar8;
        uVar5 = (uVar7 << 0x13 | uVar7 >> 0xd) ^ iVar8 - uVar7;
        uVar4 = uVar7 + iVar2;
        uVar1 = (uVar5 << 4 | uVar5 >> 0x1c) ^ iVar2 - uVar5;
        uVar3 = uVar5 + uVar4;
        length = length - 0xc;
        key = (void *)((long)key + 0xc);
      } while (0xc < length);
    }
    switch(length) {
    case 0:
      goto switchD_00110544_caseD_0;
    case 1:
      uVar5 = (uint)(byte)*key;
      goto LAB_001107e6;
    case 2:
      goto switchD_00110544_caseD_2;
    case 3:
      uVar4 = uVar4 + (uint)*(byte *)((long)key + 2) * 0x10000;
      goto switchD_00110544_caseD_2;
    case 4:
      goto switchD_00110544_caseD_4;
    case 5:
      uVar5 = (uint)(byte)*(uint *)((long)key + 4);
      goto LAB_001107e0;
    case 6:
      goto switchD_00110544_caseD_6;
    case 7:
      uVar3 = uVar3 + (uint)*(byte *)((long)key + 6) * 0x10000;
      goto switchD_00110544_caseD_6;
    case 9:
      uVar1 = uVar1 + (byte)*(uint *)((long)key + 8);
      break;
    case 10:
      goto switchD_00110544_caseD_a;
    case 0xb:
      uVar1 = uVar1 + (uint)*(byte *)((long)key + 10) * 0x10000;
      goto switchD_00110544_caseD_a;
    case 0xc:
      uVar1 = uVar1 + *(uint *)((long)key + 8);
    }
    uVar3 = uVar3 + *(uint *)((long)key + 4);
switchD_00110544_caseD_4:
    uVar5 = *key;
LAB_001107e6:
    uVar5 = uVar4 + uVar5;
    goto LAB_001107e9;
  }
  if (0xc < length) {
    do {
      uVar1 = uVar1 + *(uint *)((long)key + 8);
      uVar5 = (uVar1 * 0x10 | uVar1 >> 0x1c) ^ (uVar4 + *key) - uVar1;
      iVar2 = uVar1 + uVar3 + *(uint *)((long)key + 4);
      uVar7 = (uVar5 << 6 | uVar5 >> 0x1a) ^ (uVar3 + *(uint *)((long)key + 4)) - uVar5;
      iVar6 = uVar5 + iVar2;
      uVar1 = (uVar7 << 8 | uVar7 >> 0x18) ^ iVar2 - uVar7;
      iVar8 = uVar7 + iVar6;
      uVar7 = (uVar1 << 0x10 | uVar1 >> 0x10) ^ iVar6 - uVar1;
      iVar2 = uVar1 + iVar8;
      uVar5 = (uVar7 << 0x13 | uVar7 >> 0xd) ^ iVar8 - uVar7;
      uVar4 = uVar7 + iVar2;
      uVar1 = (uVar5 << 4 | uVar5 >> 0x1c) ^ iVar2 - uVar5;
      uVar3 = uVar5 + uVar4;
      length = length - 0xc;
      key = (void *)((long)key + 0xc);
    } while (0xc < length);
  }
  switch(length) {
  case 0:
    goto switchD_00110544_caseD_0;
  case 1:
    goto switchD_001106ed_caseD_1;
  case 2:
    goto switchD_00110544_caseD_2;
  case 3:
    uVar5 = *key & 0xffffff;
    goto LAB_001107c7;
  case 4:
    goto switchD_001105d9_caseD_4;
  case 5:
    uVar5 = (uint)(byte)*(uint *)((long)key + 4);
    break;
  case 6:
    uVar5 = (uint)(ushort)*(uint *)((long)key + 4);
    break;
  case 7:
    uVar5 = *(uint *)((long)key + 4) & 0xffffff;
    break;
  case 8:
    goto switchD_001105d9_caseD_8;
  case 9:
    uVar5 = (uint)(byte)*(uint *)((long)key + 8);
    goto LAB_0011078a;
  case 10:
    uVar5 = (uint)(ushort)*(uint *)((long)key + 8);
    goto LAB_0011078a;
  case 0xb:
    uVar5 = *(uint *)((long)key + 8) & 0xffffff;
LAB_0011078a:
    uVar1 = uVar1 + uVar5;
switchD_001105d9_caseD_8:
    uVar3 = uVar3 + *(uint *)((long)key + 4);
    goto switchD_001105d9_caseD_4;
  case 0xc:
    uVar1 = uVar1 + *(uint *)((long)key + 8);
    goto switchD_001105d9_caseD_8;
  }
  uVar3 = uVar3 + uVar5;
switchD_001105d9_caseD_4:
  uVar5 = *key;
LAB_001107c7:
  uVar5 = uVar5 + uVar4;
LAB_001107e9:
  uVar1 = (uVar1 ^ uVar3) - (uVar3 << 0xe | uVar3 >> 0x12);
  uVar5 = (uVar5 ^ uVar1) - (uVar1 * 0x800 | uVar1 >> 0x15);
  uVar7 = (uVar3 ^ uVar5) - (uVar5 * 0x2000000 | uVar5 >> 7);
  uVar1 = (uVar1 ^ uVar7) - (uVar7 * 0x10000 | uVar7 >> 0x10);
  uVar5 = (uVar5 ^ uVar1) - (uVar1 * 0x10 | uVar1 >> 0x1c);
  uVar3 = (uVar7 ^ uVar5) - (uVar5 * 0x4000 | uVar5 >> 0x12);
  uVar1 = (uVar1 ^ uVar3) - (uVar3 * 0x1000000 | uVar3 >> 8);
switchD_00110544_caseD_0:
  *pc = uVar1;
  *pb = uVar3;
  return;
switchD_001106ed_caseD_1:
  uVar5 = (uint)(byte)*key;
  goto LAB_001107c7;
switchD_00110544_caseD_a:
  uVar3 = uVar3 + *(uint *)((long)key + 4);
  uVar1 = uVar1 + (ushort)*(uint *)((long)key + 8);
  goto switchD_00110544_caseD_4;
switchD_00110544_caseD_6:
  uVar5 = (uint)(ushort)*(uint *)((long)key + 4);
LAB_001107e0:
  uVar3 = uVar3 + uVar5;
  goto switchD_00110544_caseD_4;
switchD_00110544_caseD_2:
  uVar5 = (uint)(ushort)*key;
  goto LAB_001107c7;
}

Assistant:

void hashlittle2(
  const void *key,       /* the key to hash */
  size_t      length,    /* length of the key */
  uint32_t   *pc,        /* IN: primary initval, OUT: primary hash */
  uint32_t   *pb)        /* IN: secondary initval, OUT: secondary hash */
{
  uint32_t a,b,c;                                          /* internal state */
  union { const void *ptr; size_t i; } u;     /* needed for Mac Powerbook G4 */

  /* Set up the internal state */
  a = b = c = 0xdeadbeef + ((uint32_t)length) + *pc;
  c += *pb;

  u.ptr = key;
  if (HASH_LITTLE_ENDIAN && ((u.i & 0x3) == 0)) {
    const uint32_t *k = (const uint32_t *)key;         /* read 32-bit chunks */
    const uint8_t  *k8;

    /*------ all but last block: aligned reads and affect 32 bits of (a,b,c) */
    while (length > 12)
    {
      a += k[0];
      b += k[1];
      c += k[2];
      mix(a,b,c);
      length -= 12;
      k += 3;
    }

    /*----------------------------- handle the last (probably partial) block */
    /*
     * "k[2]&0xffffff" actually reads beyond the end of the string, but
     * then masks off the part it's not allowed to read.  Because the
     * string is aligned, the masked-off tail is in the same word as the
     * rest of the string.  Every machine with memory protection I've seen
     * does it on word boundaries, so is OK with this.  But VALGRIND will
     * still catch it and complain.  The masking trick does make the hash
     * noticably faster for short strings (like English words).
     */
#ifndef VALGRIND

    switch(length)
    {
    case 12: c+=k[2]; b+=k[1]; a+=k[0]; break;
    case 11: c+=k[2]&0xffffff; b+=k[1]; a+=k[0]; break;
    case 10: c+=k[2]&0xffff; b+=k[1]; a+=k[0]; break;
    case 9 : c+=k[2]&0xff; b+=k[1]; a+=k[0]; break;
    case 8 : b+=k[1]; a+=k[0]; break;
    case 7 : b+=k[1]&0xffffff; a+=k[0]; break;
    case 6 : b+=k[1]&0xffff; a+=k[0]; break;
    case 5 : b+=k[1]&0xff; a+=k[0]; break;
    case 4 : a+=k[0]; break;
    case 3 : a+=k[0]&0xffffff; break;
    case 2 : a+=k[0]&0xffff; break;
    case 1 : a+=k[0]&0xff; break;
    case 0 : *pc=c; *pb=b; return;  /* zero length strings require no mixing */
    }

#else /* make valgrind happy */

    k8 = (const uint8_t *)k;
    switch(length)
    {
    case 12: c+=k[2]; b+=k[1]; a+=k[0]; break;
    case 11: c+=((uint32_t)k8[10])<<16;  /* fall through */
    case 10: c+=((uint32_t)k8[9])<<8;    /* fall through */
    case 9 : c+=k8[8];                   /* fall through */
    case 8 : b+=k[1]; a+=k[0]; break;
    case 7 : b+=((uint32_t)k8[6])<<16;   /* fall through */
    case 6 : b+=((uint32_t)k8[5])<<8;    /* fall through */
    case 5 : b+=k8[4];                   /* fall through */
    case 4 : a+=k[0]; break;
    case 3 : a+=((uint32_t)k8[2])<<16;   /* fall through */
    case 2 : a+=((uint32_t)k8[1])<<8;    /* fall through */
    case 1 : a+=k8[0]; break;
    case 0 : *pc=c; *pb=b; return;  /* zero length strings require no mixing */
    }

#endif /* !valgrind */

  } else if (HASH_LITTLE_ENDIAN && ((u.i & 0x1) == 0)) {
    const uint16_t *k = (const uint16_t *)key;         /* read 16-bit chunks */
    const uint8_t  *k8;

    /*--------------- all but last block: aligned reads and different mixing */
    while (length > 12)
    {
      a += k[0] + (((uint32_t)k[1])<<16);
      b += k[2] + (((uint32_t)k[3])<<16);
      c += k[4] + (((uint32_t)k[5])<<16);
      mix(a,b,c);
      length -= 12;
      k += 6;
    }

    /*----------------------------- handle the last (probably partial) block */
    k8 = (const uint8_t *)k;
    switch(length)
    {
    case 12: c+=k[4]+(((uint32_t)k[5])<<16);
             b+=k[2]+(((uint32_t)k[3])<<16);
             a+=k[0]+(((uint32_t)k[1])<<16);
             break;
    case 11: c+=((uint32_t)k8[10])<<16;     /* fall through */
    case 10: c+=k[4];
             b+=k[2]+(((uint32_t)k[3])<<16);
             a+=k[0]+(((uint32_t)k[1])<<16);
             break;
    case 9 : c+=k8[8];                      /* fall through */
    case 8 : b+=k[2]+(((uint32_t)k[3])<<16);
             a+=k[0]+(((uint32_t)k[1])<<16);
             break;
    case 7 : b+=((uint32_t)k8[6])<<16;      /* fall through */
    case 6 : b+=k[2];
             a+=k[0]+(((uint32_t)k[1])<<16);
             break;
    case 5 : b+=k8[4];                      /* fall through */
    case 4 : a+=k[0]+(((uint32_t)k[1])<<16);
             break;
    case 3 : a+=((uint32_t)k8[2])<<16;      /* fall through */
    case 2 : a+=k[0];
             break;
    case 1 : a+=k8[0];
             break;
    case 0 : *pc=c; *pb=b; return;  /* zero length strings require no mixing */
    }

  } else {                        /* need to read the key one byte at a time */
    const uint8_t *k = (const uint8_t *)key;

    /*--------------- all but the last block: affect some 32 bits of (a,b,c) */
    while (length > 12)
    {
      a += k[0];
      a += ((uint32_t)k[1])<<8;
      a += ((uint32_t)k[2])<<16;
      a += ((uint32_t)k[3])<<24;
      b += k[4];
      b += ((uint32_t)k[5])<<8;
      b += ((uint32_t)k[6])<<16;
      b += ((uint32_t)k[7])<<24;
      c += k[8];
      c += ((uint32_t)k[9])<<8;
      c += ((uint32_t)k[10])<<16;
      c += ((uint32_t)k[11])<<24;
      mix(a,b,c);
      length -= 12;
      k += 12;
    }

    /*-------------------------------- last block: affect all 32 bits of (c) */
    switch(length)                   /* all the case statements fall through */
    {
    case 12: c+=((uint32_t)k[11])<<24;
    case 11: c+=((uint32_t)k[10])<<16;
    case 10: c+=((uint32_t)k[9])<<8;
    case 9 : c+=k[8];
    case 8 : b+=((uint32_t)k[7])<<24;
    case 7 : b+=((uint32_t)k[6])<<16;
    case 6 : b+=((uint32_t)k[5])<<8;
    case 5 : b+=k[4];
    case 4 : a+=((uint32_t)k[3])<<24;
    case 3 : a+=((uint32_t)k[2])<<16;
    case 2 : a+=((uint32_t)k[1])<<8;
    case 1 : a+=k[0];
             break;
    case 0 : *pc=c; *pb=b; return;  /* zero length strings require no mixing */
    }
  }

  final(a,b,c);
  *pc=c; *pb=b;
}